

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O1

void TranslateVariableDefinition(ExpressionTranslateContext *ctx,ExprVariableDefinition *expression)

{
  bool bVar1;
  VariableData *variable;
  TypeBase *pTVar2;
  ExprBase *pEVar3;
  ExprBase *pEVar4;
  char *format;
  bool bVar5;
  
  variable = expression->variable->variable;
  Print(ctx,"/* Definition of variable \'%.*s\' */",
        (ulong)(uint)(*(int *)&(variable->name->name).end - (int)(variable->name->name).begin));
  pTVar2 = variable->type;
  bVar1 = variable->isVmAlloca;
  if (expression->initializer == (ExprBase *)0x0) {
    format = "0";
    if (((bVar1 == false) && (variable->lookupOnly == false)) &&
       (variable->scope->ownerNamespace == (NamespaceData *)0x0)) {
      if (pTVar2 == (TypeBase *)0x0) {
LAB_0014572a:
        __assert_fail("!\"unknown type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                      ,0x4aa,
                      "void TranslateVariableDefinition(ExpressionTranslateContext &, ExprVariableDefinition *)"
                     );
      }
      if (pTVar2->typeID != 1) {
        if (pTVar2 == (TypeBase *)0x0) goto LAB_0014572a;
        if (pTVar2->typeID == 2) {
          format = " = false";
        }
        else {
          if (pTVar2 == (TypeBase *)0x0) goto LAB_0014572a;
          format = " = 0";
          if (pTVar2->typeID != 3) {
            if (pTVar2 == (TypeBase *)0x0) goto LAB_0014572a;
            if (pTVar2->typeID != 4) {
              if (pTVar2 == (TypeBase *)0x0) goto LAB_0014572a;
              if (pTVar2->typeID != 5) {
                if (pTVar2 == (TypeBase *)0x0) goto LAB_0014572a;
                if (pTVar2->typeID != 6) {
                  if (pTVar2 == (TypeBase *)0x0) goto LAB_0014572a;
                  if (pTVar2->typeID != 9) {
                    if (pTVar2 == (TypeBase *)0x0) goto LAB_0014572a;
                    if (pTVar2->typeID != 10) {
                      if (pTVar2 == (TypeBase *)0x0) goto LAB_0014572a;
                      if (pTVar2->typeID != 0xb) {
                        if (pTVar2 == (TypeBase *)0x0) goto LAB_0014572a;
                        if (pTVar2->typeID != 0x12) {
                          if (pTVar2 == (TypeBase *)0x0) goto LAB_0014572a;
                          if (pTVar2->typeID == 7) {
                            format = " = 0.0f";
                          }
                          else {
                            if (pTVar2 == (TypeBase *)0x0) goto LAB_0014572a;
                            if (pTVar2->typeID == 8) {
                              format = " = 0.0";
                            }
                            else {
                              if ((pTVar2 == (TypeBase *)0x0) ||
                                 ((pTVar2->typeID != 0x10 &&
                                  ((pTVar2 == (TypeBase *)0x0 ||
                                   ((pTVar2->typeID != 0x11 &&
                                    ((pTVar2 == (TypeBase *)0x0 ||
                                     ((pTVar2->typeID != 0x13 &&
                                      ((pTVar2 == (TypeBase *)0x0 ||
                                       ((pTVar2->typeID != 0x14 &&
                                        ((pTVar2 == (TypeBase *)0x0 ||
                                         ((pTVar2->typeID != 0x15 &&
                                          ((pTVar2 == (TypeBase *)0x0 ||
                                           ((pTVar2->typeID != 0x18 &&
                                            ((pTVar2 == (TypeBase *)0x0 || (pTVar2->typeID != 0x19))
                                            )))))))))))))))))))))))) goto LAB_0014572a;
                              Print(ctx,"memset(&");
                              TranslateVariableName(ctx,variable);
                              Print(ctx,", 0, sizeof(");
                              format = "))";
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        TranslateVariableName(ctx,variable);
      }
    }
  }
  else {
    if ((bVar1 == false) && (pTVar2 != (TypeBase *)0x0 && variable->lookupOnly == false)) {
      bVar5 = pTVar2->typeID == 0x18;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      if ((bVar1 != false) || (variable->lookupOnly == true)) {
        __assert_fail("!(variable->isVmAlloca || variable->lookupOnly)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                      ,0x458,
                      "void TranslateVariableDefinition(ExpressionTranslateContext &, ExprVariableDefinition *)"
                     );
      }
      Print(ctx,"(memset(&");
      TranslateVariableName(ctx,variable);
      Print(ctx,", 0, sizeof(");
      TranslateVariableName(ctx,variable);
      Print(ctx,")), ");
    }
    pEVar3 = expression->initializer;
    if ((pEVar3 == (ExprBase *)0x0) || (pEVar4 = pEVar3, pEVar3->typeID != 0x36)) {
      pEVar4 = (ExprBase *)0x0;
    }
    if (pEVar4 == (ExprBase *)0x0) {
      Translate(ctx,pEVar3);
    }
    else {
      Print(ctx,"(");
      OutputContext::Print(ctx->output,"\n",1);
      ctx->depth = ctx->depth + 1;
      for (pEVar3 = (ExprBase *)pEVar4[1]._vptr_ExprBase; pEVar3 != (ExprBase *)0x0;
          pEVar3 = pEVar3->next) {
        PrintIndent(ctx);
        Translate(ctx,pEVar3);
        if (pEVar3->next != (ExprBase *)0x0) {
          Print(ctx,",");
        }
        OutputContext::Print(ctx->output,"\n",1);
      }
      ctx->depth = ctx->depth - 1;
      PrintIndent(ctx);
      Print(ctx,")");
    }
    if (!bVar5) {
      return;
    }
    format = ")";
  }
  Print(ctx,format);
  return;
}

Assistant:

void TranslateVariableDefinition(ExpressionTranslateContext &ctx, ExprVariableDefinition *expression)
{
	VariableData *variable = expression->variable->variable;

	Print(ctx, "/* Definition of variable '%.*s' */", FMT_ISTR(variable->name->name));

	TypeBase *type = variable->type;

	if(expression->initializer)
	{
		// Zero-initialize classes beforehand (if they are stored in a real local)
		bool zeroInitialize = !(variable->isVmAlloca || variable->lookupOnly) && isType<TypeClass>(type);

		if(zeroInitialize)
		{
			assert(!(variable->isVmAlloca || variable->lookupOnly));

			Print(ctx, "(memset(&");
			TranslateVariableName(ctx, variable);
			Print(ctx, ", 0, sizeof(");
			TranslateVariableName(ctx, variable);
			Print(ctx, ")), ");
		}

		if(ExprBlock *blockInitializer = getType<ExprBlock>(expression->initializer))
		{
			// Translate block initializer as a sequence
			Print(ctx, "(");
			PrintLine(ctx);

			ctx.depth++;

			for(ExprBase *curr = blockInitializer->expressions.head; curr; curr = curr->next)
			{
				PrintIndent(ctx);

				Translate(ctx, curr);

				if(curr->next)
					Print(ctx, ",");

				PrintLine(ctx);
			}

			ctx.depth--;

			PrintIndent(ctx);
			Print(ctx, ")");
		}
		else
		{
			Translate(ctx, expression->initializer);
		}

		if(zeroInitialize)
			Print(ctx, ")");
	}
	else if(variable->isVmAlloca || variable->lookupOnly || variable->scope->ownerNamespace)
	{
		Print(ctx, "0");
	}
	else
	{
		if(isType<TypeVoid>(type))
		{
			Print(ctx, "0");
		}
		else if(isType<TypeBool>(type))
		{
			TranslateVariableName(ctx, variable);
			Print(ctx, " = false");
		}
		else if(isType<TypeChar>(type) || isType<TypeShort>(type) || isType<TypeInt>(type) || isType<TypeLong>(type) || isType<TypeTypeID>(type) || isType<TypeFunctionID>(type) || isType<TypeNullptr>(type) || isType<TypeRef>(type))
		{
			TranslateVariableName(ctx, variable);
			Print(ctx, " = 0");
		}
		else if(isType<TypeFloat>(type))
		{
			TranslateVariableName(ctx, variable);
			Print(ctx, " = 0.0f");
		}
		else if(isType<TypeDouble>(type))
		{
			TranslateVariableName(ctx, variable);
			Print(ctx, " = 0.0");
		}
		else if(isType<TypeAutoRef>(type) || isType<TypeAutoArray>(type) || isType<TypeArray>(type) || isType<TypeUnsizedArray>(type) || isType<TypeFunction>(type) || isType<TypeClass>(type) || isType<TypeEnum>(type))
		{
			Print(ctx, "memset(&");
			TranslateVariableName(ctx, variable);
			Print(ctx, ", 0, sizeof(");
			TranslateVariableName(ctx, variable);
			Print(ctx, "))");
		}
		else
		{
			assert(!"unknown type");
		}
	}
}